

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

EnvironmentEstimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *
Catch::Benchmark::Detail::estimate_clock_resolution<std::chrono::_V2::steady_clock>
          (EnvironmentEstimate<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
           *__return_storage_ptr__,int iterations)

{
  iterator iVar1;
  iterator iVar2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last;
  ClockDuration<std::chrono::_V2::steady_clock> how_long;
  _func_vector<double,_std::allocator<double>_>_int **in_R8;
  double local_68;
  code *local_60;
  rep_conflict local_58;
  TimingOf<std::chrono::_V2::steady_clock,_std::vector<double>_(*)(int),_run_for_at_least_argument_t<steady_clock,_vector<double,_allocator<double>_>_(*)(int)>_>
  local_50;
  undefined1 local_28 [8];
  vector<double,_std::allocator<double>_> r;
  int iterations_local;
  
  r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = iterations;
  local_58 = (rep_conflict)
             std::chrono::
             duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000l>>
                       ((duration<long,_std::ratio<1L,_1000L>_> *)&clock_resolution_estimation_time)
  ;
  how_long.__r._4_4_ = 0;
  how_long.__r._0_4_ =
       r.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._4_4_;
  local_60 = resolution<std::chrono::_V2::steady_clock>;
  last._M_current = (double *)&local_60;
  run_for_at_least<std::chrono::_V2::steady_clock,std::vector<double,std::allocator<double>>(*)(int)>
            (&local_50,(Detail *)local_58,how_long,(int)last._M_current,in_R8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_28,&local_50.result);
  Timing<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::vector<double,_std::allocator<double>_>_>
  ::~Timing(&local_50);
  iVar1 = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)local_28);
  iVar2 = std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)local_28);
  local_68 = mean<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                       ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                        iVar1._M_current,
                        (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                        iVar2._M_current);
  std::chrono::duration<double,std::ratio<1l,1000000000l>>::duration<double,void>
            ((duration<double,std::ratio<1l,1000000000l>> *)__return_storage_ptr__,&local_68);
  iVar1 = std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)local_28);
  iVar2 = std::vector<double,_std::allocator<double>_>::end
                    ((vector<double,_std::allocator<double>_> *)local_28);
  classify_outliers<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            (&__return_storage_ptr__->outliers,(Detail *)iVar1._M_current,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             iVar2._M_current,last);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_28);
  return __return_storage_ptr__;
}

Assistant:

EnvironmentEstimate<FloatDuration<Clock>> estimate_clock_resolution(int iterations) {
                auto r = run_for_at_least<Clock>(std::chrono::duration_cast<ClockDuration<Clock>>(clock_resolution_estimation_time), iterations, &resolution<Clock>)
                    .result;
                return {
                    FloatDuration<Clock>(mean(r.begin(), r.end())),
                    classify_outliers(r.begin(), r.end()),
                };
            }